

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

void KBuffer_vprintf(KonohaContext *kctx,KBuffer *wb,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  ulong minsize;
  undefined4 *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t n;
  size_t s;
  KGrowingArray *m;
  va_list ap2;
  KGrowingArray *m_00;
  KonohaContext *kctx_00;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 local_18;
  long local_8;
  
  local_28 = *(undefined8 *)(in_RCX + 4);
  local_38 = *in_RCX;
  uStack_34 = in_RCX[1];
  uStack_30 = in_RCX[2];
  uStack_2c = in_RCX[3];
  kctx_00 = (KonohaContext *)*in_RSI;
  m_00 = (KGrowingArray *)kctx_00->safepoint;
  local_18 = in_RDX;
  local_8 = in_RDI;
  iVar1 = (**(code **)(*(long *)(in_RDI + 0x10) + 0x70))
                    ((long)&m_00->bytesize + (long)&kctx_00->esp->field_0,
                     (long)kctx_00->platApi - (long)m_00,in_RDX,in_RCX);
  minsize = (ulong)iVar1;
  if ((ulong)((long)kctx_00->platApi - (long)m_00) <= minsize) {
    KArray_Expand(kctx_00,m_00,minsize);
    iVar1 = (**(code **)(*(long *)(local_8 + 0x10) + 0x70))
                      ((long)&m_00->bytesize + (long)&kctx_00->esp->field_0,
                       (long)kctx_00->platApi - (long)m_00,local_18,&local_38);
    minsize = (ulong)iVar1;
  }
  kctx_00->safepoint = minsize + kctx_00->safepoint;
  return;
}

Assistant:

static void KBuffer_vprintf(KonohaContext *kctx, KBuffer *wb, const char *fmt, va_list ap)
{
	va_list ap2;
#ifdef _MSC_VER
	ap2 = ap;
#else
	va_copy(ap2, ap);
#endif
	KGrowingArray *m = wb->m;
	size_t s = m->bytesize;
	size_t n = PLATAPI vsnprintf_i( m->bytebuf + s, m->bytemax - s, fmt, ap);
	if(n >= (m->bytemax - s)) {
		KArray_Expand(kctx, m, n + 1);
		n = PLATAPI vsnprintf_i(m->bytebuf + s, m->bytemax - s, fmt, ap2);
	}
	va_end(ap2);
	m->bytesize += n;
}